

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O1

bool __thiscall IR::Float32ConstOpnd::IsEqualInternal(Float32ConstOpnd *this,Opnd *opnd)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((this->super_Opnd).m_kind != OpndKindFloat32Const) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x74c,"(m_kind == OpndKindFloat32Const)","m_kind == OpndKindFloat32Const");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if ((opnd->m_kind == OpndKindFloat32Const) && ((this->super_Opnd).m_type == opnd->m_type)) {
    bVar2 = (bool)(-(*(float *)&opnd[1]._vptr_Opnd == this->m_value) & 1);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool
Float32ConstOpnd::IsEqualInternal(Opnd *opnd)
{
    Assert(m_kind == OpndKindFloat32Const);
    if (!opnd->IsFloat32ConstOpnd() || this->GetType() != opnd->GetType() /* TODO: could this be turned into an assert*/)
    {
        return false;
    }

    return m_value == opnd->AsFloat32ConstOpnd()->m_value;
}